

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

string * __thiscall
Parser::getTokenName_abi_cxx11_(string *__return_storage_ptr__,Parser *this,int num)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             ((this->tokenNames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + num));
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::getTokenName(int num) const
{
	return tokenNames[num];
}